

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typechecking.cc
# Opt level: O2

void __thiscall
tchecker::details::expression_typechecker_t::visit
          (expression_typechecker_t *this,array_expression_t *expr)

{
  expression_type_t type;
  expression_type_t type_00;
  element_type *peVar1;
  element_type *peVar2;
  bool bVar3;
  string *this_00;
  expression_type_t expr_type;
  shared_ptr<tchecker::typed_expression_t> typed_offset;
  shared_ptr<const_tchecker::typed_var_expression_t> typed_variable;
  undefined1 local_10c [4];
  undefined1 local_108 [32];
  string local_e8;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  expression_visitor_t local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  shared_ptr<tchecker::typed_expression_t> local_58;
  string local_48;
  
  peVar1 = (expr->_variable).
           super___shared_ptr<const_tchecker::var_expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (**(code **)(*(long *)peVar1 + 0x18))(peVar1,this);
  acquire_typed_expression((expression_typechecker_t *)local_108);
  std::dynamic_pointer_cast<tchecker::typed_var_expression_t_const,tchecker::typed_expression_t>
            (&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_108 + 8));
  type = (local_58.super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->_type;
  peVar2 = (expr->_offset).
           super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar2->_vptr_expression_t[3])(peVar2,this);
  acquire_typed_expression((expression_typechecker_t *)&local_68);
  type_00 = *(expression_type_t *)(local_68._vptr_expression_visitor_t + 1);
  bVar3 = integer_dereference(type);
  if (bVar3) {
    bVar3 = integer_valued(type_00);
    if (bVar3) {
      if ((type & ~EXPR_TYPE_INTTERM) == EXPR_TYPE_LOCALINTVAR) {
        local_10c = (undefined1  [4])0x7;
      }
      else {
        local_10c = (undefined1  [4])0x6;
      }
      goto LAB_001b50cb;
    }
  }
  bVar3 = clock_dereference(type);
  if (bVar3) {
    bVar3 = integer_valued(type_00);
    if (bVar3) {
      local_10c = (undefined1  [4])0xa;
      goto LAB_001b50cb;
    }
  }
  local_10c = (undefined1  [4])0x0;
LAB_001b50cb:
  std::
  make_shared<tchecker::typed_array_expression_t,tchecker::expression_type_t&,std::shared_ptr<tchecker::typed_var_expression_t_const>const&,std::shared_ptr<tchecker::typed_expression_t>const&>
            ((expression_type_t *)local_108,
             (shared_ptr<const_tchecker::typed_var_expression_t> *)local_10c,&local_58);
  std::__shared_ptr<tchecker::typed_expression_t,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<tchecker::typed_expression_t,(__gnu_cxx::_Lock_policy)2> *)
             &this->_typed_expr,
             (__shared_ptr<tchecker::typed_array_expression_t,_(__gnu_cxx::_Lock_policy)2> *)
             local_108);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_108 + 8));
  if ((type_00 != EXPR_TYPE_BAD) && (local_10c == (undefined1  [4])0x0)) {
    bVar3 = integer_valued(type_00);
    if (bVar3) {
      expression_t::to_string_abi_cxx11_
                (&local_c8,(expression_t *)(&expr->field_0x0 + *(long *)(*(long *)expr + -0x38)));
      std::operator+(&local_a8,"in expression ",&local_c8);
      std::operator+(&local_88,&local_a8,", invalid array variable ");
      peVar1 = (expr->_variable).
               super___shared_ptr<const_tchecker::var_expression_t,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      expression_t::to_string_abi_cxx11_
                ((string *)(local_108 + 0x20),
                 (expression_t *)((long)&peVar1->field_0x0 + *(long *)(*(long *)peVar1 + -0x38)));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                     &local_88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_108 + 0x20));
      std::
      function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::operator()(&this->_error,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108);
      std::__cxx11::string::~string((string *)local_108);
      std::__cxx11::string::~string((string *)(local_108 + 0x20));
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
      this_00 = &local_c8;
    }
    else {
      expression_t::to_string_abi_cxx11_
                ((string *)(local_108 + 0x20),
                 (expression_t *)(&expr->field_0x0 + *(long *)(*(long *)expr + -0x38)));
      std::operator+(&local_c8,"in expression ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_108 + 0x20));
      std::operator+(&local_a8,&local_c8,", array subscript ");
      expression_t::to_string_abi_cxx11_
                (&local_48,
                 (expr->_offset).
                 super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                );
      std::operator+(&local_88,&local_a8,&local_48);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                     &local_88," does not have an integral value");
      std::
      function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::operator()(&this->_error,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108);
      std::__cxx11::string::~string((string *)local_108);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_c8);
      this_00 = (string *)(local_108 + 0x20);
    }
    std::__cxx11::string::~string((string *)this_00);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

virtual void visit(tchecker::array_expression_t const & expr)
  {
    // Typecheck variable
    expr.variable().visit(*this);
    auto const typed_variable = std::dynamic_pointer_cast<tchecker::typed_var_expression_t const>(acquire_typed_expression());
    auto const variable_type = typed_variable->type();

    // Typecheck offset
    expr.offset().visit(*this);
    auto const typed_offset = acquire_typed_expression();
    auto const offset_type = typed_offset->type();

    // Typed expression
    enum tchecker::expression_type_t expr_type;

    if (integer_dereference(variable_type) && integer_valued(offset_type)) {
      if ((variable_type == tchecker::EXPR_TYPE_LOCALINTVAR) || (variable_type == tchecker::EXPR_TYPE_LOCALINTARRAY))
        expr_type = tchecker::EXPR_TYPE_LOCALINTLVALUE;
      else
        expr_type = tchecker::EXPR_TYPE_INTLVALUE;
    }
    else if (clock_dereference(variable_type) && integer_valued(offset_type))
      expr_type = tchecker::EXPR_TYPE_CLKLVALUE;
    else
      expr_type = tchecker::EXPR_TYPE_BAD;

    _typed_expr = std::make_shared<tchecker::typed_array_expression_t>(expr_type, typed_variable, typed_offset);

    // Report bad type
    if (expr_type != tchecker::EXPR_TYPE_BAD)
      return;

    if (offset_type != tchecker::EXPR_TYPE_BAD) {
      if (!integer_valued(offset_type))
        _error("in expression " + expr.to_string() + ", array subscript " + expr.offset().to_string() +
               " does not have an integral value");
      else
        _error("in expression " + expr.to_string() + ", invalid array variable " + expr.variable().to_string());
    }
  }